

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O1

bool __thiscall
glcts::GeometryShaderMaxTextureUnitsTest::verifyResult
          (GeometryShaderMaxTextureUnitsTest *this,void *data)

{
  long lVar1;
  ostringstream *this_00;
  GLuint GVar2;
  pointer p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int *piVar11;
  bool bVar12;
  GLint expected_value;
  bool local_1dd;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1dd = this->m_max_texture_units < 1;
  if (0 < this->m_max_texture_units) {
    GVar2 = this->m_texture_width;
    this_00 = (ostringstream *)(local_1b0 + 8);
    lVar7 = 0;
    do {
      p_Var3 = (this->m_textures).
               super__Vector_base<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxTextureUnitsTest::_texture_data>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = lVar7 + 1;
      iVar6 = ((int)lVar1 * (p_Var3[lVar7].data + p_Var3->data)) / 2;
      iVar9 = (int)lVar7 * 0x20;
      lVar8 = 0;
      do {
        iVar5 = GVar2 * (int)lVar8 * 0x10;
        uVar10 = (ulong)(uint)(iVar5 + iVar9);
        if (*(int *)((long)data + uVar10) == iVar6) {
          piVar11 = (int *)((ulong)(iVar5 + iVar9 + 0x10) + (long)data);
          iVar5 = 0;
          bVar12 = false;
          do {
            bVar4 = bVar12;
            if (bVar4) goto LAB_00d1936a;
            bVar12 = true;
          } while (*piVar11 == iVar6);
        }
        else {
          piVar11 = (int *)(uVar10 + (long)data);
          bVar4 = false;
        }
        local_1b0._0_8_ =
             ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Wrong result! Expected: ",0x18);
        std::ostream::operator<<(this_00,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Extracted: ",0xc);
        std::ostream::operator<<(this_00,*piVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Point: ",8);
        std::ostream::operator<<(this_00,(int)lVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," X: ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Y: ",4);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        iVar5 = 1;
LAB_00d1936a:
        if (!bVar4) goto LAB_00d19385;
        bVar12 = lVar8 == 0;
        lVar8 = lVar8 + 1;
      } while (bVar12);
      iVar5 = 5;
LAB_00d19385:
    } while (((iVar5 == 5) || (iVar5 == 0)) &&
            (local_1dd = this->m_max_texture_units <= lVar1, lVar7 = lVar1,
            lVar1 < this->m_max_texture_units));
  }
  return local_1dd;
}

Assistant:

bool GeometryShaderMaxTextureUnitsTest::verifyResult(const void* data)
{
	const unsigned char* result_image = (const unsigned char*)data;
	const unsigned int   line_size	= m_texture_width * m_texture_pixel_size;

	/* For each drawn point */
	for (glw::GLint point = 0; point < m_max_texture_units; ++point)
	{
		const glw::GLint   first_value	= m_textures[0].data;
		const glw::GLint   last_value	 = m_textures[point].data;
		const glw::GLint   expected_value = ((first_value + last_value) * (point + 1)) / 2;
		const unsigned int point_offset   = point * m_texture_pixel_size * m_point_size;

		/* Verify all pixels that belong to point, area m_point_size x m_point_size */
		for (unsigned int y = 0; y < m_point_size; ++y)
		{
			const unsigned int line_offset		  = y * line_size;
			const unsigned int first_texel_offset = line_offset + point_offset;

			for (unsigned int x = 0; x < m_point_size; ++x)
			{
				const unsigned int texel_offset = first_texel_offset + x * m_texture_pixel_size;

				if (0 != memcmp(result_image + texel_offset, &expected_value, sizeof(expected_value)))
				{
					glw::GLint* result_value = (glw::GLint*)(result_image + texel_offset);

					m_testCtx.getLog() << tcu::TestLog::Message << "Wrong result! "
																   "Expected: "
									   << expected_value << " Extracted: " << *result_value << " Point: " << point
									   << " X: " << x << " Y: " << y << tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}